

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::node_output_attributes
               (xml_buffered_writer *writer,xml_node_struct *node,char_t *indent,
               size_t indent_length,uint flags,uint depth)

{
  xml_buffered_writer *in_RCX;
  size_t __n;
  undefined8 in_RDX;
  void *pvVar1;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  long in_RSI;
  xml_buffered_writer *in_RDI;
  uint in_R8D;
  int in_R9D;
  xml_attribute_struct *a;
  char_t enquotation_char;
  char_t *default_name;
  xml_buffered_writer *s;
  xml_buffered_writer *writer_00;
  undefined2 in_stack_ffffffffffffffbc;
  uint depth_00;
  char cVar2;
  size_t indent_length_00;
  undefined7 in_stack_ffffffffffffffc8;
  char *writer_01;
  
  writer_01 = ":anonymous";
  __n = (size_t)(in_R8D & 0x200);
  pvVar1 = (void *)CONCAT71((int7)((ulong)in_RDX >> 8),0x22);
  depth_00 = CONCAT13(0x27,CONCAT12(0x22,in_stack_ffffffffffffffbc));
  if ((in_R8D & 0x200) == 0) {
    depth_00 = CONCAT13(0x22,CONCAT12(0x22,in_stack_ffffffffffffffbc));
  }
  cVar2 = (char)(depth_00 >> 0x18);
  for (indent_length_00 = *(size_t *)(in_RSI + 0x38); indent_length_00 != 0;
      indent_length_00 = *(size_t *)(indent_length_00 + 0x20)) {
    if ((in_R8D & 0x44) == 0x40) {
      xml_buffered_writer::write(in_RDI,10,pvVar1,__n);
      __n = (size_t)(in_R9D + 1);
      text_output_indent((xml_buffered_writer *)writer_01,
                         (char_t *)CONCAT17(cVar2,in_stack_ffffffffffffffc8),indent_length_00,
                         depth_00);
    }
    else {
      xml_buffered_writer::write(in_RDI,0x20,pvVar1,__n);
    }
    s = (xml_buffered_writer *)writer_01;
    if (*(long *)(indent_length_00 + 8) != 0) {
      s = *(xml_buffered_writer **)(indent_length_00 + 8);
    }
    writer_00 = in_RDI;
    xml_buffered_writer::write_string(in_RCX,(char_t *)CONCAT44(in_R8D,in_R9D));
    xml_buffered_writer::write(in_RDI,0x3d,(void *)(ulong)(uint)(int)cVar2,__n);
    pvVar1 = extraout_RDX;
    if (*(long *)(indent_length_00 + 0x10) != 0) {
      __n = (size_t)in_R8D;
      text_output(writer_00,s->buffer,0,0x15c832);
      pvVar1 = extraout_RDX_00;
    }
    xml_buffered_writer::write(in_RDI,(int)cVar2,pvVar1,__n);
    pvVar1 = extraout_RDX_01;
  }
  return;
}

Assistant:

PUGI_IMPL_FN void node_output_attributes(xml_buffered_writer& writer, xml_node_struct* node, const char_t* indent, size_t indent_length, unsigned int flags, unsigned int depth)
	{
		const char_t* default_name = PUGIXML_TEXT(":anonymous");
		const char_t enquotation_char = (flags & format_attribute_single_quote) ? '\'' : '"';

		for (xml_attribute_struct* a = node->first_attribute; a; a = a->next_attribute)
		{
			if ((flags & (format_indent_attributes | format_raw)) == format_indent_attributes)
			{
				writer.write('\n');

				text_output_indent(writer, indent, indent_length, depth + 1);
			}
			else
			{
				writer.write(' ');
			}

			writer.write_string(a->name ? a->name + 0 : default_name);
			writer.write('=', enquotation_char);

			if (a->value)
				text_output(writer, a->value, ctx_special_attr, flags);

			writer.write(enquotation_char);
		}
	}